

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::determinedRuleNeedsToRun
          (CAPIBuildSystemFrontendDelegate *this,Rule *ruleNeedingToRun,RunReason reason,
          Rule *inputRule)

{
  CAPIBuildKey *this_00;
  CAPIBuildKey *this_01;
  BuildKey inputKey;
  BuildKey key;
  BuildKey local_68;
  BuildKey local_48;
  
  if ((this->cAPIDelegate).determined_rule_needs_to_run !=
      (_func_void_void_ptr_llb_build_key_t_ptr_llb_rule_run_reason_t_llb_build_key_t_ptr *)0x0) {
    llbuild::buildsystem::BuildKey::fromData(&local_48,&ruleNeedingToRun->key);
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    CAPIBuildKey::CAPIBuildKey(this_00,&local_48);
    if (inputRule == (Rule *)0x0) {
      this_01 = (CAPIBuildKey *)0x0;
    }
    else {
      llbuild::buildsystem::BuildKey::fromData(&local_68,&inputRule->key);
      this_01 = (CAPIBuildKey *)operator_new(0x38);
      CAPIBuildKey::CAPIBuildKey(this_01,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.key.key._M_dataplus._M_p != &local_68.key.key.field_2) {
        operator_delete(local_68.key.key._M_dataplus._M_p,
                        local_68.key.key.field_2._M_allocated_capacity + 1);
      }
    }
    if (Forced < reason) {
      __assert_fail("0 && \"unknown reason\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                    ,0x1ef,
                    "static llb_rule_run_reason_t (anonymous namespace)::CAPIBuildSystemFrontendDelegate::convertRunReason(core::Rule::RunReason)"
                   );
    }
    (*(this->cAPIDelegate).determined_rule_needs_to_run)
              ((this->cAPIDelegate).context,(llb_build_key_t *)this_00,reason,
               (llb_build_key_t *)this_01);
    llb_build_key_destroy((llb_build_key_t *)this_00);
    if (this_01 != (CAPIBuildKey *)0x0) {
      llb_build_key_destroy((llb_build_key_t *)this_01);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.key.key._M_dataplus._M_p != &local_48.key.key.field_2) {
      operator_delete(local_48.key.key._M_dataplus._M_p,
                      local_48.key.key.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

virtual void determinedRuleNeedsToRun(core::Rule* ruleNeedingToRun, core::Rule::RunReason reason, core::Rule* inputRule) override {
    if (cAPIDelegate.determined_rule_needs_to_run) {
      auto key = BuildKey::fromData(ruleNeedingToRun->key);
      auto needsToRun = (llb_build_key_t *)new CAPIBuildKey(key);
      llb_build_key_t * input;
      if (inputRule) {
        auto inputKey = BuildKey::fromData(inputRule->key);
        input = (llb_build_key_t *)new CAPIBuildKey(inputKey);
      } else {
        input = nullptr;
      }
      cAPIDelegate.determined_rule_needs_to_run(cAPIDelegate.context, needsToRun, convertRunReason(reason), input);
      llb_build_key_destroy(needsToRun);
      if (input) {
        llb_build_key_destroy(input);
      }
    }
  }